

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  Location *pLVar1;
  bool bVar2;
  int iVar3;
  DescriptorProto *message_00;
  EnumDescriptorProto *enum_type;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions;
  MessageOptions *options;
  FieldDescriptorProto *field;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar4;
  undefined1 local_98 [8];
  LocationRecorder location_5;
  LocationRecorder location_4;
  LocationRecorder location_3;
  LocationRecorder location_2;
  LocationRecorder location_1;
  undefined1 local_38 [8];
  LocationRecorder location;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)message_location;
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = LookingAt(this,"message");
    pLVar1 = location.location_;
    if (bVar2) {
      iVar3 = DescriptorProto::nested_type_size(message);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_38,(LocationRecorder *)pLVar1,3,iVar3);
      message_00 = DescriptorProto::add_nested_type(message);
      this_local._7_1_ = ParseMessageDefinition(this,message_00,(LocationRecorder *)local_38);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
    }
    else {
      bVar2 = LookingAt(this,"enum");
      pLVar1 = location.location_;
      if (bVar2) {
        iVar3 = DescriptorProto::enum_type_size(message);
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)&location_2.location_,(LocationRecorder *)pLVar1,4,iVar3);
        enum_type = DescriptorProto::add_enum_type(message);
        this_local._7_1_ =
             ParseEnumDefinition(this,enum_type,(LocationRecorder *)&location_2.location_);
        LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
      }
      else {
        bVar2 = LookingAt(this,"extensions");
        if (bVar2) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&location_3.location_,
                     (LocationRecorder *)location.location_,5);
          this_local._7_1_ = ParseExtensions(this,message,(LocationRecorder *)&location_3.location_)
          ;
          LocationRecorder::~LocationRecorder((LocationRecorder *)&location_3.location_);
        }
        else {
          bVar2 = LookingAt(this,"extend");
          if (bVar2) {
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)&location_4.location_,
                       (LocationRecorder *)location.location_,6);
            extensions = DescriptorProto::mutable_extension(message);
            pRVar4 = DescriptorProto::mutable_nested_type(message);
            this_local._7_1_ =
                 ParseExtend(this,extensions,pRVar4,(LocationRecorder *)location.location_,3,
                             (LocationRecorder *)&location_4.location_);
            LocationRecorder::~LocationRecorder((LocationRecorder *)&location_4.location_);
          }
          else {
            bVar2 = LookingAt(this,"option");
            pLVar1 = location.location_;
            if (bVar2) {
              LocationRecorder::LocationRecorder
                        ((LocationRecorder *)&location_5.location_,
                         (LocationRecorder *)location.location_,7);
              options = DescriptorProto::mutable_options(message);
              this_local._7_1_ =
                   ParseOption(this,&options->super_Message,
                               (LocationRecorder *)&location_5.location_,OPTION_STATEMENT);
              LocationRecorder::~LocationRecorder((LocationRecorder *)&location_5.location_);
            }
            else {
              iVar3 = DescriptorProto::field_size(message);
              LocationRecorder::LocationRecorder
                        ((LocationRecorder *)local_98,(LocationRecorder *)pLVar1,2,iVar3);
              field = DescriptorProto::add_field(message);
              pRVar4 = DescriptorProto::mutable_nested_type(message);
              this_local._7_1_ =
                   ParseMessageField(this,field,pRVar4,(LocationRecorder *)location.location_,3,
                                     (LocationRecorder *)local_98);
              LocationRecorder::~LocationRecorder((LocationRecorder *)local_98);
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(),
                       message_location,
                       DescriptorProto::kNestedTypeFieldNumber,
                       location);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, OPTION_STATEMENT);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(message->add_field(),
                             message->mutable_nested_type(),
                             message_location,
                             DescriptorProto::kNestedTypeFieldNumber,
                             location);
  }
}